

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char cVar17;
  char cVar18;
  bool bVar19;
  uint32_t uVar20;
  SPIRType *pSVar21;
  uint uVar22;
  ulong uVar23;
  SmallVector<unsigned_int,_8UL> *pSVar24;
  uint __val;
  bool bVar25;
  string *expr;
  string __str;
  string subexpr;
  string local_200;
  SPIRType *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  SPIRType *local_1d0;
  string *local_1c8;
  string local_1c0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 local_180 [192];
  SmallVector<unsigned_int,_8UL> local_c0;
  ImageType local_88;
  TypeID TStack_70;
  TypeID TStack_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  bVar25 = false;
  if (type->basetype == Boolean && parent_type->basetype == Struct) {
    bVar25 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  local_180._0_8_ = &PTR__SPIRType_003a2fa8;
  local_180._8_4_ = 0;
  local_180._12_4_ = 0;
  local_180._16_4_ = Unknown;
  local_180._20_4_ = 0;
  local_180._24_4_ = 1;
  local_180._28_4_ = 1;
  this_00 = (SmallVector<unsigned_int,_8UL> *)(local_180 + 0x20);
  local_180._32_8_ = local_180 + 0x38;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_8_ = local_180._120_8_ & 0xffff000000000000;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_88.sampled = 0;
  local_88.format = ImageFormatUnknown;
  local_88.access = AccessQualifierReadOnly;
  TStack_70.id = 0;
  TStack_6c.id = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar24 = this_00;
  local_1d0 = parent_type;
  local_1c8 = base_expr;
  if (bVar25) {
    pSVar21 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
    local_180._8_4_ = (pSVar21->super_IVariant).self.id;
    local_180._28_4_ = pSVar21->columns;
    uVar1 = *(undefined8 *)&(pSVar21->super_IVariant).field_0xc;
    uVar2 = pSVar21->width;
    uVar3 = pSVar21->vecsize;
    local_180._12_4_ = (undefined4)uVar1;
    local_180._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_180._20_4_ = uVar2;
    local_180._24_4_ = uVar3;
    SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar21->array);
    SmallVector<bool,_8UL>::operator=
              ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&pSVar21->array_size_literal);
    local_180._120_4_ = pSVar21->pointer_depth;
    local_180[0x7c] = pSVar21->pointer;
    local_180[0x7d] = pSVar21->forward_pointer;
    local_180._126_2_ = *(undefined2 *)&pSVar21->field_0x7e;
    local_180._128_4_ = pSVar21->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_180 + 0x88),
               &pSVar21->member_types);
    SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar21->member_type_index_redirection);
    uVar4._0_4_ = (pSVar21->image).type;
    uVar4._4_4_ = (pSVar21->image).dim;
    uVar5._0_1_ = (pSVar21->image).depth;
    uVar5._1_1_ = (pSVar21->image).arrayed;
    uVar5._2_1_ = (pSVar21->image).ms;
    uVar5._3_1_ = (pSVar21->image).field_0xb;
    uVar5._4_4_ = (pSVar21->image).sampled;
    uVar6 = (pSVar21->image).format;
    uVar7 = (pSVar21->image).access;
    uVar8 = pSVar21->type_alias;
    uVar9 = pSVar21->parent_type;
    local_88._0_7_ = SUB87(uVar4,0);
    local_88.dim._3_1_ = (undefined1)((uint)uVar4._4_4_ >> 0x18);
    local_88._8_3_ = SUB83(uVar5,0);
    local_88._11_1_ = uVar5._3_1_;
    local_88.sampled = uVar5._4_4_;
    local_88.format = uVar6;
    local_88.access = uVar7;
    TStack_70.id = uVar8;
    TStack_6c.id = uVar9;
    if (pSVar21 != (SPIRType *)local_180) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&(pSVar21->member_name_cache)._M_h);
    }
    local_180._16_4_ = (this->backend).boolean_in_struct_remapped_type;
    bVar25 = true;
  }
  else {
    bVar25 = false;
    if ((type->basetype == Boolean) && ((this->backend).boolean_in_struct_remapped_type != Boolean))
    {
      pSVar21 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (type->parent_type).id);
      local_180._8_4_ = (pSVar21->super_IVariant).self.id;
      local_180._28_4_ = pSVar21->columns;
      uVar1 = *(undefined8 *)&(pSVar21->super_IVariant).field_0xc;
      uVar10 = pSVar21->width;
      uVar11 = pSVar21->vecsize;
      local_180._12_4_ = (undefined4)uVar1;
      local_180._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      local_180._20_4_ = uVar10;
      local_180._24_4_ = uVar11;
      SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar21->array);
      SmallVector<bool,_8UL>::operator=
                ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&pSVar21->array_size_literal);
      local_180._120_4_ = pSVar21->pointer_depth;
      local_180[0x7c] = pSVar21->pointer;
      local_180[0x7d] = pSVar21->forward_pointer;
      local_180._126_2_ = *(undefined2 *)&pSVar21->field_0x7e;
      local_180._128_4_ = pSVar21->storage;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_180 + 0x88)
                 ,&pSVar21->member_types);
      SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar21->member_type_index_redirection);
      uVar1._0_4_ = (pSVar21->image).type;
      uVar1._4_4_ = (pSVar21->image).dim;
      uVar12._0_1_ = (pSVar21->image).depth;
      uVar12._1_1_ = (pSVar21->image).arrayed;
      uVar12._2_1_ = (pSVar21->image).ms;
      uVar12._3_1_ = (pSVar21->image).field_0xb;
      uVar12._4_4_ = (pSVar21->image).sampled;
      uVar13 = (pSVar21->image).format;
      uVar14 = (pSVar21->image).access;
      uVar15 = pSVar21->type_alias;
      uVar16 = pSVar21->parent_type;
      local_88._0_7_ = SUB87(uVar1,0);
      local_88.dim._3_1_ = (undefined1)((uint)uVar1._4_4_ >> 0x18);
      local_88._8_3_ = SUB83(uVar12,0);
      bVar25 = true;
      local_88._11_1_ = uVar12._3_1_;
      local_88.sampled = uVar12._4_4_;
      local_88.format = uVar13;
      local_88.access = uVar14;
      TStack_70.id = uVar15;
      TStack_6c.id = uVar16;
      if (pSVar21 != (SPIRType *)local_180) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&(pSVar21->member_name_cache)._M_h);
      }
    }
  }
  uVar20 = to_array_size_literal
                     (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
  local_1e0 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
  local_1d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  if (uVar20 != 0) {
    __val = 0;
    do {
      cVar18 = '\x01';
      if (9 < __val) {
        uVar23 = (ulong)__val;
        cVar17 = '\x04';
        do {
          cVar18 = cVar17;
          uVar22 = (uint)uVar23;
          if (uVar22 < 100) {
            cVar18 = cVar18 + -2;
            goto LAB_00262285;
          }
          if (uVar22 < 1000) {
            cVar18 = cVar18 + -1;
            goto LAB_00262285;
          }
          if (uVar22 < 10000) goto LAB_00262285;
          uVar23 = uVar23 / 10000;
          cVar17 = cVar18 + '\x04';
        } while (99999 < uVar22);
        cVar18 = cVar18 + '\x01';
      }
LAB_00262285:
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_200,cVar18);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_200._M_dataplus._M_p,(uint)local_200._M_string_length,__val);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_1c0,(spirv_cross *)local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e4336,
                 (char (*) [2])&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ef80f,
                 (char (*) [2])pSVar24);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      bVar19 = Compiler::is_array(&this->super_Compiler,local_1e0);
      if (bVar19) {
        to_rerolled_array_expression(&local_200,this,local_1d0,&local_1c0,local_1e0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
      }
      else {
        if (bVar25) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_1a0,this,local_180,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_200,(spirv_cross *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3040b9,
                     (char (*) [2])&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f9b8,
                     (char (*) [2])pSVar24);
          ::std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          if (local_1a0[0] != local_190) {
            operator_delete(local_1a0[0]);
          }
        }
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
      }
      __val = __val + 1;
      if (__val < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
    } while (__val != uVar20);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_180._0_8_ = &PTR__SPIRType_003a2fa8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type { OpNop };
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!is_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}